

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJFileReader.cpp
# Opt level: O2

void __thiscall MeshLib::OBJFileReader::~OBJFileReader(OBJFileReader *this)

{
  Point *pPVar1;
  int k;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < (this->tArray).m_nSize; iVar2 = iVar2 + 1) {
    pPVar1 = Array<MeshLib::Point>::GetAt(&this->tArray,iVar2);
    if (pPVar1 != (Point *)0x0) {
      operator_delete(pPVar1);
    }
  }
  for (iVar2 = 0; iVar2 < (this->nArray).m_nSize; iVar2 = iVar2 + 1) {
    pPVar1 = Array<MeshLib::Point>::GetAt(&this->nArray,iVar2);
    if (pPVar1 != (Point *)0x0) {
      operator_delete(pPVar1);
    }
  }
  Array<MeshLib::Point>::~Array(&this->nArray);
  Array<MeshLib::Point>::~Array(&this->tArray);
  return;
}

Assistant:

OBJFileReader::~OBJFileReader() {
	for(int i = 0; i< tArray.GetSize(); i++) {
		Point * p = tArray.GetAt(i);
		if( p != NULL)
			delete p;
	}

	for(int k = 0; k< nArray.GetSize(); k++) {
		Point * p = nArray.GetAt(k);
		if( p != NULL)
			delete p;
	}
}